

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O2

void __thiscall xray_re::xr_light_object::xr_light_object(xr_light_object *this,xr_scene *scene)

{
  xr_custom_object::xr_custom_object(&this->super_xr_custom_object,scene,TOOLS_CLASS_LIGHT);
  (this->super_xr_custom_object)._vptr_xr_custom_object =
       (_func_int **)&PTR__xr_light_object_00239be0;
  *(undefined4 *)&(this->super_xr_custom_object).field_0x6c = 1;
  this->m_brightness = 1.0;
  this->m_range = 8.0;
  this->m_attenuation_constant = 1.0;
  this->m_attenuation_linear = 0.0;
  this->m_attenuation_quadratic = 0.0;
  this->m_cone_angle = 0.3926991;
  this->m_unknown = 0.0;
  this->m_use_in_d3d = 1;
  this->m_flags = 1;
  this->m_control = 0;
  (this->m_animation)._M_dataplus._M_p = (pointer)&(this->m_animation).field_2;
  (this->m_animation)._M_string_length = 0;
  (this->m_animation).field_2._M_local_buf[0] = '\0';
  (this->m_texture)._M_dataplus._M_p = (pointer)&(this->m_texture).field_2;
  (this->m_texture)._M_string_length = 0;
  (this->m_texture).field_2._M_local_buf[0] = '\0';
  (this->m_vertices).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_color).r = 1.0;
  (this->m_color).g = 1.0;
  (this->m_color).b = 1.0;
  (this->m_color).a = 0.0;
  (this->m_shape).type = '\0';
  (this->m_shape).fixme.x = 1.0;
  (this->m_shape).fixme.y = 0.1;
  (this->m_shape).fixme.z = 0.1;
  (this->m_shape).fixme.w = 0.1;
  return;
}

Assistant:

xr_light_object::xr_light_object(xr_scene& scene):
	xr_custom_object(scene, TOOLS_CLASS_LIGHT),
	m_type(D3D_LIGHT_POINT),
	m_brightness(1.f),
	m_range(8.f),
	m_attenuation_constant(1.f),
	m_attenuation_linear(0),
	m_attenuation_quadratic(0),
	m_cone_angle(float(M_PI/8)),
	m_unknown(0),
	m_use_in_d3d(1),
	m_flags(LIGHT_FLAG_LIGHTMAP),
	m_control(0)
{
	m_color.set(1.f, 1.f, 1.f, 0);
	// FIXME
	m_shape.type = FUZZY_SPHERE;
	m_shape.fixme.set(1.f, 0.1f, 0.1f, 0.1f);
}